

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

void __thiscall ADPlanner::PrintSearchState(ADPlanner *this,ADState *searchstateinfo,FILE *fOut)

{
  CKey key;
  undefined1 local_10 [16];
  
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x36])(local_10,this,searchstateinfo);
  return;
}

Assistant:

void ADPlanner::PrintSearchState(ADState* searchstateinfo, FILE* fOut)
{
    CKey key = ComputeKey(searchstateinfo);
#if DEBUG
    SBPL_FPRINTF(fOut, "g=%d v=%d h = %d heapindex=%d inconslist=%d key=[%d %d] iterc=%d callnuma=%d expands=%d (current callnum=%d iter=%d)",
        searchstateinfo->g, searchstateinfo->v, searchstateinfo->h, searchstateinfo->heapindex, (searchstateinfo->listelem[AD_INCONS_LIST_ID] != NULL),
        (int)key[0], (int)key[1], searchstateinfo->iterationclosed, searchstateinfo->callnumberaccessed, searchstateinfo->numofexpands,
        this->pSearchStateSpace_->callnumber, this->pSearchStateSpace_->searchiteration);
#else
    SBPL_FPRINTF(fOut, "g=%d v=%d h = %d heapindex=%d inconslist=%d key=[%d %d] iterc=%d callnuma=%d "
                 "(current callnum=%d iter=%d)",
                 searchstateinfo->g, searchstateinfo->v, searchstateinfo->h, searchstateinfo->heapindex,
                 (searchstateinfo->listelem[AD_INCONS_LIST_ID] != NULL), (int)key[0], (int)key[1],
                 searchstateinfo->iterationclosed, searchstateinfo->callnumberaccessed,
                 this->pSearchStateSpace_->callnumber, this->pSearchStateSpace_->searchiteration);
#endif
}